

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# some_types.h
# Opt level: O1

void hiberlite::
     hibernate<hiberlite::AVisitor<hiberlite::KillChildren>,std::__cxx11::string,std::__cxx11::string>
               (AVisitor<hiberlite::KillChildren> *ar,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *m,uint param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  collection_nvp<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_hiberlite::stl_map_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  body;
  string local_180;
  collection_nvp<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_hiberlite::stl_map_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  stl_map_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f0;
  collection_nvp<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_hiberlite::stl_map_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"items","");
  paVar1 = &local_f0.xx.first.field_2;
  local_f0.xx.first._M_string_length = 0;
  local_f0.xx.first.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_f0.xx.second.field_2;
  local_f0.xx.second._M_string_length = 0;
  local_f0.xx.second.field_2._M_local_buf[0] = '\0';
  local_f0.it._M_node = (m->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_f0.ct = m;
  local_f0.xx.first._M_dataplus._M_p = (pointer)paVar1;
  local_f0.xx.second._M_dataplus._M_p = (pointer)paVar2;
  collection_nvp<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_hiberlite::stl_map_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::collection_nvp(&local_a0,&local_180,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.xx.second._M_dataplus._M_p != paVar2) {
    operator_delete(local_f0.xx.second._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.xx.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.xx.first._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  paVar1 = &local_160.name.field_2;
  local_160.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,local_a0.name._M_dataplus._M_p,
             local_a0.name._M_dataplus._M_p + local_a0.name._M_string_length);
  local_160.stream.ct = local_a0.stream.ct;
  local_160.stream.it._M_node = local_a0.stream.it._M_node;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair(&local_160.stream.xx,&local_a0.stream.xx);
  AVisitor<hiberlite::KillChildren>::operator&(ar,&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.stream.xx.second._M_dataplus._M_p != &local_160.stream.xx.second.field_2) {
    operator_delete(local_160.stream.xx.second._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.stream.xx.first._M_dataplus._M_p != &local_160.stream.xx.first.field_2) {
    operator_delete(local_160.stream.xx.first._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_160.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.stream.xx.second._M_dataplus._M_p != &local_a0.stream.xx.second.field_2) {
    operator_delete(local_a0.stream.xx.second._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.stream.xx.first._M_dataplus._M_p != &local_a0.stream.xx.first.field_2) {
    operator_delete(local_a0.stream.xx.first._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.name._M_dataplus._M_p != &local_a0.name.field_2) {
    operator_delete(local_a0.name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void hibernate(A& ar, std::map<Key,Data>& m, const unsigned int)
{
	typedef std::pair<Key,Data> ElType;
	collection_nvp<ElType,stl_map_adapter<Key,Data> >
			body( "items", stl_map_adapter<Key,Data>(m) );
	ar & body;
}